

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O0

void StopHTTPServer(void)

{
  long lVar1;
  bool bVar2;
  reference ppeVar3;
  size_t sVar4;
  _func_void_int_short_void_ptr *p_Var5;
  long in_FS_OFFSET;
  evhttp_bound_socket *socket;
  vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_> *__range1;
  thread *thread;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  Level in_stack_00000060;
  unsigned_long *in_stack_00000070;
  size_t n_connections;
  iterator __end1;
  iterator __begin1;
  iterator __end2;
  iterator __begin2;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffed8;
  HTTPRequestTracker *in_stack_fffffffffffffee8;
  char *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  ConstevalFormatString<0U> in_stack_ffffffffffffff68;
  string_view in_stack_ffffffffffffff70;
  string_view in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),Trace);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    in_stack_ffffffffffffff20 = "Stopping HTTP server\n";
    in_stack_fffffffffffffeb8 = 1;
    in_stack_fffffffffffffec0 = "Stopping HTTP server\n";
    LogPrintFormatInternal<>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,in_stack_ffffffffffffff2c,
               0x111ccd2,in_stack_00000060,in_stack_ffffffffffffff68);
  }
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>
                      *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  if (bVar2) {
    bVar2 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),Trace);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      in_stack_fffffffffffffeb8 = 1;
      in_stack_fffffffffffffec0 = "Waiting for HTTP worker threads to exit\n";
      LogPrintFormatInternal<>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,in_stack_ffffffffffffff2c,
                 (LogFlags)in_stack_ffffffffffffff20,in_stack_00000060,in_stack_ffffffffffffff68);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::begin
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffec0);
    std::vector<std::thread,_std::allocator<std::thread>_>::end
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_fffffffffffffec0);
    while (bVar2 = __gnu_cxx::
                   operator==<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                             (in_stack_fffffffffffffec8,
                              (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                               *)in_stack_fffffffffffffec0), ((bVar2 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator*((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                 *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      std::thread::join();
      __gnu_cxx::
      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
      operator++((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                  *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::clear
              ((vector<std::thread,_std::allocator<std::thread>_> *)
               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  std::vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>::begin
            ((vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_> *)
             in_stack_fffffffffffffec0);
  std::vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>::end
            ((vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_> *)
             in_stack_fffffffffffffec0);
  while (bVar2 = __gnu_cxx::
                 operator==<evhttp_bound_socket_**,_std::vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>_>
                           ((__normal_iterator<evhttp_bound_socket_**,_std::vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>_>
                             *)in_stack_fffffffffffffec8,
                            (__normal_iterator<evhttp_bound_socket_**,_std::vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>_>
                             *)in_stack_fffffffffffffec0), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppeVar3 = __gnu_cxx::
              __normal_iterator<evhttp_bound_socket_**,_std::vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>_>
              ::operator*((__normal_iterator<evhttp_bound_socket_**,_std::vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>_>
                           *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    evhttp_del_accept_socket(eventHTTP,*ppeVar3);
    __gnu_cxx::
    __normal_iterator<evhttp_bound_socket_**,_std::vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>_>
    ::operator++((__normal_iterator<evhttp_bound_socket_**,_std::vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>_>
                  *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  }
  std::vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_>::clear
            ((vector<evhttp_bound_socket_*,_std::allocator<evhttp_bound_socket_*>_> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  sVar4 = HTTPRequestTracker::CountActiveConnections
                    ((HTTPRequestTracker *)in_stack_fffffffffffffec0);
  if ((sVar4 != 0) &&
     (bVar2 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),Trace)
     , bVar2)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    in_stack_fffffffffffffeb8 = 1;
    LogPrintFormatInternal<unsigned_long>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,in_stack_ffffffffffffff2c,
               (LogFlags)in_stack_ffffffffffffff20,in_stack_00000060,
               (ConstevalFormatString<1U>)in_stack_ffffffffffffff68.fmt,in_stack_00000070);
  }
  HTTPRequestTracker::WaitUntilEmpty(in_stack_fffffffffffffee8);
  if (eventHTTP != (evhttp *)0x0) {
    in_stack_fffffffffffffed8 = (basic_string_view<char,_std::char_traits<char>_> *)eventBase;
    p_Var5 = StopHTTPServer()::$_0::operator_cast_to_function_pointer
                       ((anon_class_1_0_00000001 *)
                        CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    event_base_once(in_stack_fffffffffffffed8,0xffffffff,1,p_Var5,0);
  }
  if (eventBase != (event_base *)0x0) {
    bVar2 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),Trace);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      in_stack_fffffffffffffeb8 = 1;
      LogPrintFormatInternal<>
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,in_stack_ffffffffffffff2c,
                 (LogFlags)in_stack_ffffffffffffff20,in_stack_00000060,in_stack_ffffffffffffff68);
    }
    bVar2 = std::thread::joinable
                      ((thread *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
    if (bVar2) {
      std::thread::join();
    }
    event_base_free(eventBase);
    eventBase = (event_base *)0x0;
  }
  std::unique_ptr<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>::reset
            ((unique_ptr<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),(pointer)0x8f5cbb);
  bVar2 = LogAcceptCategory(CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),Trace);
  if (bVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    LogPrintFormatInternal<>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,in_stack_ffffffffffffff2c,
               (LogFlags)in_stack_ffffffffffffff20,in_stack_00000060,in_stack_ffffffffffffff68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void StopHTTPServer()
{
    LogDebug(BCLog::HTTP, "Stopping HTTP server\n");
    if (g_work_queue) {
        LogDebug(BCLog::HTTP, "Waiting for HTTP worker threads to exit\n");
        for (auto& thread : g_thread_http_workers) {
            thread.join();
        }
        g_thread_http_workers.clear();
    }
    // Unlisten sockets, these are what make the event loop running, which means
    // that after this and all connections are closed the event loop will quit.
    for (evhttp_bound_socket *socket : boundSockets) {
        evhttp_del_accept_socket(eventHTTP, socket);
    }
    boundSockets.clear();
    {
        if (const auto n_connections{g_requests.CountActiveConnections()}; n_connections != 0) {
            LogDebug(BCLog::HTTP, "Waiting for %d connections to stop HTTP server\n", n_connections);
        }
        g_requests.WaitUntilEmpty();
    }
    if (eventHTTP) {
        // Schedule a callback to call evhttp_free in the event base thread, so
        // that evhttp_free does not need to be called again after the handling
        // of unfinished request connections that follows.
        event_base_once(eventBase, -1, EV_TIMEOUT, [](evutil_socket_t, short, void*) {
            evhttp_free(eventHTTP);
            eventHTTP = nullptr;
        }, nullptr, nullptr);
    }
    if (eventBase) {
        LogDebug(BCLog::HTTP, "Waiting for HTTP event thread to exit\n");
        if (g_thread_http.joinable()) g_thread_http.join();
        event_base_free(eventBase);
        eventBase = nullptr;
    }
    g_work_queue.reset();
    LogDebug(BCLog::HTTP, "Stopped HTTP server\n");
}